

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::command_node::~command_node(command_node *this)

{
  command_node *pcVar1;
  
  pcVar1 = this->head;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar1 = this->start;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  pcVar1 = this->next;
  if (pcVar1 != (command_node *)0x0) {
    ~command_node(pcVar1);
  }
  operator_delete(pcVar1,0x58);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

command_node::~command_node()
    {
        delete head;
        delete start;
        delete next;
    }